

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

Edge * __thiscall Graph::findEdge(Graph *this,int originID,int destinyID)

{
  Vertex *pVVar1;
  Edge *pEVar2;
  Edge **ppEVar3;
  
  do {
    pVVar1 = this->verticesList;
    if (pVVar1 == (Vertex *)0x0) {
      return (Edge *)0x0;
    }
    ppEVar3 = &pVVar1->edgesList;
    while (pEVar2 = *ppEVar3, pEVar2 != (Edge *)0x0) {
      if ((pEVar2->origin->id == originID) && (pEVar2->destiny->id == destinyID)) {
        return pEVar2;
      }
      ppEVar3 = &pEVar2->nextEdge;
    }
    this = (Graph *)&pVVar1->nextVertex;
  } while( true );
}

Assistant:

Edge *Graph::findEdge(int originID, int destinyID){
    for(Vertex *v= get_verticesList(); v != NULL; v= v->getNext()){
        for(Edge *a= v->getEdgesList(); a != NULL; a= a->getNext()){
            if(a->getOrigin()->getID() == originID && a->getDestiny()->getID() == destinyID)
                return a;
        }
    }
    return NULL;
}